

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_sse2.c
# Opt level: O0

void convolve_x_sr_12tap_sse2
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,int subpel_x_qn,ConvolveParams *conv_params)

{
  ushort uVar1;
  uint uVar2;
  __m128i zero_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  undefined1 (*pauVar7) [16];
  int in_ECX;
  int iVar8;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar9 [16];
  long in_stack_00000008;
  int val;
  __m128i res;
  __m128i res16;
  __m128i res32_round;
  __m128i res32;
  __m128i s [4];
  __m128i data;
  int j;
  int i;
  __m128i coeffs [6];
  __m128i zero;
  __m128i round_shift;
  __m128i round_0_shift;
  __m128i round_const;
  __m128i round_0_const;
  int bits;
  uint8_t *src_ptr;
  int fo_horiz;
  undefined1 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc69;
  undefined1 in_stack_fffffffffffffc6a;
  undefined1 in_stack_fffffffffffffc6b;
  undefined1 in_stack_fffffffffffffc6c;
  undefined1 in_stack_fffffffffffffc6d;
  undefined1 in_stack_fffffffffffffc6e;
  undefined1 in_stack_fffffffffffffc6f;
  undefined1 in_stack_fffffffffffffc74;
  undefined1 in_stack_fffffffffffffc75;
  undefined1 in_stack_fffffffffffffc76;
  undefined1 in_stack_fffffffffffffc77;
  InterpFilterParams *in_stack_fffffffffffffc78;
  int local_300;
  int local_2fc;
  byte local_244;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  undefined2 local_68;
  undefined2 uStack_66;
  undefined2 local_58;
  undefined2 uStack_56;
  undefined2 local_48;
  undefined2 uStack_46;
  undefined2 uStack_44;
  undefined2 uStack_42;
  undefined2 local_38;
  undefined2 uStack_36;
  undefined2 uStack_34;
  undefined2 uStack_32;
  undefined2 uStack_24;
  undefined2 uStack_22;
  undefined2 uStack_14;
  undefined2 uStack_12;
  
  uVar1 = *(ushort *)(in_stack_00000008 + 8);
  uVar5 = 7 - *(int *)(res[1] + 0x14);
  iVar8 = (1 << (*(byte *)(res[1] + 0x14) & 0x1f)) >> 1;
  local_244 = (byte)uVar5;
  iVar6 = (1 << (local_244 & 0x1f)) >> 1;
  uVar2 = *(uint *)(res[1] + 0x14);
  prepare_coeffs_12tap
            (in_stack_fffffffffffffc78,
             CONCAT13(in_stack_fffffffffffffc77,
                      CONCAT12(in_stack_fffffffffffffc76,
                               CONCAT11(in_stack_fffffffffffffc75,in_stack_fffffffffffffc74))),
             (__m128i *)
             CONCAT17(in_stack_fffffffffffffc6f,
                      CONCAT16(in_stack_fffffffffffffc6e,
                               CONCAT15(in_stack_fffffffffffffc6d,
                                        CONCAT14(in_stack_fffffffffffffc6c,
                                                 CONCAT13(in_stack_fffffffffffffc6b,
                                                          CONCAT12(in_stack_fffffffffffffc6a,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffffc69,
                                                  in_stack_fffffffffffffc68))))))));
  local_2fc = 0;
  do {
    local_300 = 0;
    do {
      pauVar7 = (undefined1 (*) [16])
                ((in_RDI - (int)((uVar1 >> 1) - 1)) + (long)(local_2fc * in_ESI + local_300));
      auVar3 = *pauVar7;
      auVar9 = *pauVar7;
      uStack_14 = (undefined2)((ulong)*(undefined8 *)*pauVar7 >> 0x20);
      uStack_12 = (undefined2)((ulong)*(undefined8 *)*pauVar7 >> 0x30);
      uStack_24 = SUB162(*pauVar7,5);
      uStack_22 = SUB162(*pauVar7,7);
      local_38 = auVar9._2_2_;
      uStack_36 = auVar9._4_2_;
      uStack_34 = auVar9._6_2_;
      uStack_32 = auVar9._8_2_;
      local_48 = auVar9._3_2_;
      uStack_46 = auVar9._5_2_;
      uStack_44 = auVar9._7_2_;
      uStack_42 = auVar9._9_2_;
      local_58 = auVar3._4_2_;
      uStack_56 = auVar3._6_2_;
      local_68 = auVar3._5_2_;
      uStack_66 = auVar3._7_2_;
      zero_00[0]._2_2_ = uStack_24;
      zero_00[0]._0_2_ = uStack_14;
      zero_00[0]._4_2_ = uStack_12;
      zero_00[0]._6_2_ = uStack_22;
      zero_00[1]._0_2_ = local_38;
      zero_00[1]._2_2_ = local_48;
      zero_00[1]._4_2_ = uStack_36;
      zero_00[1]._6_2_ = uStack_46;
      convolve_lo_x_12tap((__m128i *)
                          CONCAT26(uStack_66,CONCAT24(uStack_56,CONCAT22(local_68,local_58))),
                          (__m128i *)
                          CONCAT26(uStack_42,CONCAT24(uStack_32,CONCAT22(uStack_44,uStack_34))),
                          zero_00);
      local_158 = (int)extraout_XMM0_Qa;
      iStack_154 = (int)((ulong)extraout_XMM0_Qa >> 0x20);
      iStack_150 = (int)extraout_XMM0_Qb;
      iStack_14c = (int)((ulong)extraout_XMM0_Qb >> 0x20);
      auVar3 = ZEXT416(uVar2);
      auVar9 = ZEXT416(uVar5);
      auVar4._4_4_ = (iStack_154 + iVar8 >> auVar3) + iVar6 >> auVar9;
      auVar4._0_4_ = (local_158 + iVar8 >> auVar3) + iVar6 >> auVar9;
      auVar4._12_4_ = (iStack_14c + iVar8 >> auVar3) + iVar6 >> auVar9;
      auVar4._8_4_ = (iStack_150 + iVar8 >> auVar3) + iVar6 >> auVar9;
      auVar9 = packssdw(auVar4,ZEXT816(0));
      local_f8 = auVar9._0_2_;
      sStack_f6 = auVar9._2_2_;
      sStack_f4 = auVar9._4_2_;
      sStack_f2 = auVar9._6_2_;
      *(uint *)(in_RDX + local_2fc * in_ECX + (long)local_300) =
           CONCAT13((0 < sStack_f2) * (sStack_f2 < 0x100) * auVar9[6] - (0xff < sStack_f2),
                    CONCAT12((0 < sStack_f4) * (sStack_f4 < 0x100) * auVar9[4] - (0xff < sStack_f4),
                             CONCAT11((0 < sStack_f6) * (sStack_f6 < 0x100) * auVar9[2] -
                                      (0xff < sStack_f6),
                                      (0 < local_f8) * (local_f8 < 0x100) * auVar9[0] -
                                      (0xff < local_f8))));
      local_300 = local_300 + 4;
    } while (local_300 < in_R8D);
    local_2fc = local_2fc + 1;
  } while (local_2fc < in_R9D);
  return;
}

Assistant:

static void convolve_x_sr_12tap_sse2(const uint8_t *src, int src_stride,
                                     uint8_t *dst, int dst_stride, int w, int h,
                                     const InterpFilterParams *filter_params_x,
                                     int subpel_x_qn,
                                     ConvolveParams *conv_params) {
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint8_t *src_ptr = src - fo_horiz;
  const int bits = FILTER_BITS - conv_params->round_0;
  const __m128i round_0_const =
      _mm_set1_epi32((1 << conv_params->round_0) >> 1);
  const __m128i round_const = _mm_set1_epi32((1 << bits) >> 1);
  const __m128i round_0_shift = _mm_cvtsi32_si128(conv_params->round_0);
  const __m128i round_shift = _mm_cvtsi32_si128(bits);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeffs[6];

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

  prepare_coeffs_12tap(filter_params_x, subpel_x_qn, coeffs);

  int i = 0;
  do {
    int j = 0;
    do {
      const __m128i data =
          _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);
      __m128i s[4];

      s[0] = _mm_unpacklo_epi16(data, _mm_srli_si128(data, 1));
      s[1] =
          _mm_unpacklo_epi16(_mm_srli_si128(data, 2), _mm_srli_si128(data, 3));
      s[2] =
          _mm_unpacklo_epi16(_mm_srli_si128(data, 4), _mm_srli_si128(data, 5));
      s[3] =
          _mm_unpacklo_epi16(_mm_srli_si128(data, 6), _mm_srli_si128(data, 7));

      const __m128i res32 = convolve_lo_x_12tap(s, coeffs, zero);

      __m128i res32_round =
          _mm_sra_epi32(_mm_add_epi32(res32, round_0_const), round_0_shift);
      res32_round =
          _mm_sra_epi32(_mm_add_epi32(res32_round, round_const), round_shift);

      const __m128i res16 = _mm_packs_epi32(res32_round, zero);
      const __m128i res = _mm_packus_epi16(res16, zero);

      const int val = _mm_cvtsi128_si32(res);
      memcpy((dst + i * dst_stride + j), &val, sizeof(val));
      j += 4;
    } while (j < w);
  } while (++i < h);
}